

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O0

void pmpcfg_csr_write_riscv32
               (CPURISCVState_conflict *env,uint32_t reg_index,target_ulong_conflict val)

{
  uint local_1c;
  uint8_t cfg_val;
  int i;
  target_ulong_conflict val_local;
  uint32_t reg_index_local;
  CPURISCVState_conflict *env_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pmp_write_cfg(env,reg_index * 4 + local_1c,(uint8_t)(val >> ((byte)(local_1c << 3) & 0x1f)));
  }
  return;
}

Assistant:

void pmpcfg_csr_write(CPURISCVState *env, uint32_t reg_index,
    target_ulong val)
{
    int i;
    uint8_t cfg_val;

    if ((reg_index & 1) && (sizeof(target_ulong) == 8)) {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpcfg write - incorrect address\n");
        return;
    }

    for (i = 0; i < sizeof(target_ulong); i++) {
        cfg_val = (val >> 8 * i)  & 0xff;
        pmp_write_cfg(env, (reg_index * sizeof(target_ulong)) + i,
            cfg_val);
    }
}